

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

iterator * __thiscall Catch::TextFlow::Columns::iterator::operator++(iterator *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference this_00;
  const_iterator local_40;
  ulong local_18;
  size_t i;
  iterator *this_local;
  
  i = (size_t)this;
  for (local_18 = 0; uVar1 = local_18,
      sVar3 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size
                        (this->m_columns), uVar1 < sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::
             vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
             ::operator[](&this->m_iterators,local_18);
    this_00 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
              operator[](this->m_columns,local_18);
    Column::end(&local_40,this_00);
    bVar2 = Column::const_iterator::operator!=(pvVar4,&local_40);
    if (bVar2) {
      pvVar4 = std::
               vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
               ::operator[](&this->m_iterators,local_18);
      Column::const_iterator::operator++(pvVar4);
    }
  }
  return this;
}

Assistant:

Columns::iterator& Columns::iterator::operator++() {
            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                if ( m_iterators[i] != m_columns[i].end() ) {
                    ++m_iterators[i];
                }
            }
            return *this;
        }